

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpotController.cpp
# Opt level: O3

void anon_unknown.dwarf_5e224c::local_aggregate
               (char *query,Caliper *c,ChannelBody *chB,CaliperMetadataDB *db,Aggregator *output_agg
               )

{
  Aggregator agg;
  Preprocessor prp;
  RecordSelector filter;
  QuerySpec spec;
  Aggregator local_238;
  _Any_data local_228;
  code *local_218;
  code *pcStack_210;
  _Any_data local_208;
  code *local_1f8;
  Preprocessor local_1e8;
  RecordSelector local_1d8;
  QuerySpec local_1c8;
  
  parse_spec(&local_1c8,query);
  cali::RecordSelector::RecordSelector(&local_1d8,&local_1c8);
  cali::Preprocessor::Preprocessor(&local_1e8,&local_1c8);
  cali::Aggregator::Aggregator(&local_238,&local_1c8);
  local_218 = (code *)0x0;
  pcStack_210 = (code *)0x0;
  local_228._M_unused._M_object = (void *)0x0;
  local_228._8_8_ = 0;
  local_228._M_unused._M_object = operator_new(0x20);
  *(CaliperMetadataDB **)local_228._M_unused._0_8_ = db;
  *(RecordSelector **)((long)local_228._M_unused._0_8_ + 8) = &local_1d8;
  *(Preprocessor **)((long)local_228._M_unused._0_8_ + 0x10) = &local_1e8;
  *(Aggregator **)((long)local_228._M_unused._0_8_ + 0x18) = &local_238;
  pcStack_210 = std::
                _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/controllers/SpotController.cpp:59:9)>
                ::_M_invoke;
  local_218 = std::
              _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/controllers/SpotController.cpp:59:9)>
              ::_M_manager;
  cali::Caliper::flush(c,chB,(SnapshotView)ZEXT816(0),(SnapshotFlushFn *)&local_228);
  if (local_218 != (code *)0x0) {
    (*local_218)(&local_228,&local_228,__destroy_functor);
  }
  std::
  function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
  ::function<cali::Aggregator&,void>
            ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
              *)local_208._M_pod_data,output_agg);
  cali::Aggregator::flush
            (&local_238,&db->super_CaliperMetadataAccessInterface,(SnapshotProcessFn *)&local_208);
  if (local_1f8 != (code *)0x0) {
    (*local_1f8)(&local_208,&local_208,__destroy_functor);
  }
  cali::Aggregator::~Aggregator(&local_238);
  cali::Preprocessor::~Preprocessor(&local_1e8);
  cali::RecordSelector::~RecordSelector(&local_1d8);
  std::vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>::
  ~vector(&local_1c8.preprocess_ops);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1c8.units._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1c8.aliases._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1c8.format.kwargs._M_t);
  std::vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_>::~vector
            (&local_1c8.sort.list);
  std::vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_>::~vector
            (&local_1c8.filter.list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8.select.list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8.groupby.list);
  std::vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>::
  ~vector(&local_1c8.aggregate.list);
  return;
}

Assistant:

void local_aggregate(const char* query, Caliper& c, ChannelBody* chB, CaliperMetadataDB& db, Aggregator& output_agg)
{
    QuerySpec spec(parse_spec(query));

    RecordSelector filter(spec);
    Preprocessor   prp(spec);
    Aggregator     agg(spec);

    c.flush(
        chB,
        SnapshotView(),
        [&db, &filter, &prp, &agg](CaliperMetadataAccessInterface& in_db, const std::vector<Entry>& rec) {
            EntryList mrec = prp.process(db, db.merge_snapshot(in_db, rec));

            if (filter.pass(db, mrec))
                agg.add(db, mrec);
        }
    );

    // write intermediate results into output aggregator
    agg.flush(db, output_agg);
}